

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
resizeLike<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,4,1,0,4,1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
          (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *this,
          EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
          *_other)

{
  Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  *this_00;
  Index IVar1;
  Index IVar2;
  Index IVar3;
  bool bVar4;
  Index othersize;
  Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  *other;
  EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *_other_local;
  PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_local;
  
  this_00 = EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
            ::derived(_other);
  Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
  ::rows(this_00);
  Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
  ::cols(this_00);
  IVar1 = Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
          ::rows(this_00);
  IVar2 = Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
          ::cols(this_00);
  IVar3 = Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
          ::rows(this_00);
  bVar4 = true;
  if (IVar3 != 1) {
    IVar3 = Product<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
            ::cols(this_00);
    bVar4 = IVar3 == 1;
  }
  if (!bVar4) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x16e,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, 3, 1>, OtherDerived = Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, 4, 1>>, Eigen::Matrix<double, -1, -1>>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this,IVar1 * IVar2,1);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }